

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob_config.cc
# Opt level: O1

Config * __thiscall QPDFJob::Config::flattenAnnotations(Config *this,string *parameter)

{
  int *piVar1;
  int iVar2;
  string local_38;
  
  ((this->o->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
  flatten_annotations = true;
  iVar2 = std::__cxx11::string::compare((char *)parameter);
  if (iVar2 == 0) {
    piVar1 = &((this->o->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
              ->flatten_annotations_forbidden;
    *piVar1 = *piVar1 | 0x20;
  }
  else {
    iVar2 = std::__cxx11::string::compare((char *)parameter);
    if (iVar2 == 0) {
      piVar1 = &((this->o->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr)->flatten_annotations_required;
      *piVar1 = *piVar1 | 4;
    }
    else {
      iVar2 = std::__cxx11::string::compare((char *)parameter);
      if (iVar2 != 0) {
        local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_38,"invalid flatten-annotations option","");
        usage(&local_38);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_38._M_dataplus._M_p != &local_38.field_2) {
          operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
        }
      }
    }
  }
  return this;
}

Assistant:

QPDFJob::Config*
QPDFJob::Config::flattenAnnotations(std::string const& parameter)
{
    o.m->flatten_annotations = true;
    if (parameter == "screen") {
        o.m->flatten_annotations_forbidden |= an_no_view;
    } else if (parameter == "print") {
        o.m->flatten_annotations_required |= an_print;
    } else if (parameter != "all") {
        usage("invalid flatten-annotations option");
    }
    return this;
}